

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall pbrt::QuadMesh::getBounds(box3f *__return_storage_ptr__,QuadMesh *this)

{
  box3f *this_00;
  pointer pvVar1;
  undefined8 uVar2;
  float fVar3;
  pointer pvVar4;
  vec3f v;
  vec3f local_40;
  
  if (this->haveComputedBounds == false) {
    std::mutex::lock(&this->mutex);
    this_00 = &this->bounds;
    if (this->haveComputedBounds == true) {
      fVar3 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar3;
      fVar3 = (this_00->lower).y;
      uVar2 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (this_00->lower).x;
      (__return_storage_ptr__->lower).y = fVar3;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar2;
    }
    else {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      pvVar1 = (this->vertex).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pvVar4 = (this->vertex).
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1; pvVar4 = pvVar4 + 1)
      {
        local_40.z = pvVar4->z;
        local_40.x = pvVar4->x;
        local_40.y = pvVar4->y;
        math::box3f::extend(this_00,&local_40);
      }
      this->haveComputedBounds = true;
      fVar3 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar3;
      fVar3 = (this_00->lower).y;
      uVar2 = *(undefined8 *)&(this->bounds).lower.z;
      (__return_storage_ptr__->lower).x = (this_00->lower).x;
      (__return_storage_ptr__->lower).y = fVar3;
      *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  else {
    fVar3 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar3;
    fVar3 = (this->bounds).lower.y;
    uVar2 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar3;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) bounds.extend(v);
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }